

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O0

bool __thiscall HighsCallback::callbackActive(HighsCallback *this,int callback_type)

{
  bool bVar1;
  uint in_ESI;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_RDI;
  bool callback_type_ok;
  bool local_31;
  reference local_28;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar1 = std::function::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    local_31 = in_ESI < 10;
    if (local_31) {
      local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_RDI,
                            CONCAT44(in_ESI,CONCAT13(local_31,(int3)in_stack_ffffffffffffffe8)));
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_28);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsCallback::callbackActive(const int callback_type) {
  // Check that callback function has been defined
  if (!this->user_callback) return false;
  // Check that callback_type is within range
  const bool callback_type_ok =
      callback_type >= kCallbackMin && callback_type <= kCallbackMax;
  assert(callback_type_ok);
  if (!callback_type_ok) return false;
  // Don't call callback if it is not active
  assert(this->active.size() > 0);
  if (!this->active[callback_type]) return false;
  return true;
}